

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

char * MIR_alias_name(MIR_context_t ctx,MIR_alias_t alias)

{
  size_t sVar1;
  MIR_error_func_t p_Var2;
  string_t *psVar3;
  MIR_alias_t alias_local;
  MIR_context_t ctx_local;
  
  if (alias == 0) {
    ctx_local = (MIR_context_t)0x1c4426;
  }
  else {
    sVar1 = VARR_string_tlength(ctx->alias_ctx->aliases);
    if (sVar1 <= alias) {
      p_Var2 = MIR_get_error_func(ctx);
      (*p_Var2)(MIR_alloc_error,"Wrong alias number");
    }
    psVar3 = VARR_string_taddr(ctx->alias_ctx->aliases);
    ctx_local = (MIR_context_t)psVar3[alias].str.s;
  }
  return (char *)ctx_local;
}

Assistant:

const char *MIR_alias_name (MIR_context_t ctx, MIR_alias_t alias) {
  if (alias == 0) return "";
  if (alias >= VARR_LENGTH (string_t, aliases))
    MIR_get_error_func (ctx) (MIR_alloc_error, "Wrong alias number");
  return VARR_ADDR (string_t, aliases)[alias].str.s;
}